

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-socket-buffer-size.c
# Opt level: O3

int run_test_socket_buffer_size(void)

{
  int iVar1;
  int extraout_EAX;
  uv_tcp_t *unaff_RBX;
  uv_udp_t *loop;
  uv_udp_t *loop_00;
  uv_tcp_t *puVar2;
  sockaddr_in addr;
  int iStack_24;
  uv_loop_t *puStack_20;
  sockaddr_in sStack_18;
  
  loop_00 = (uv_udp_t *)0x1a4b3a;
  puStack_20 = (uv_loop_t *)0x16966d;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_18);
  if (iVar1 == 0) {
    puStack_20 = (uv_loop_t *)0x16967a;
    loop_00 = (uv_udp_t *)uv_default_loop();
    puStack_20 = (uv_loop_t *)0x169689;
    iVar1 = uv_tcp_init((uv_loop_t *)loop_00,&tcp);
    if (iVar1 != 0) goto LAB_00169778;
    puVar2 = &tcp;
    puStack_20 = (uv_loop_t *)0x1696a2;
    iVar1 = uv_tcp_bind(&tcp,(sockaddr *)&sStack_18,0);
    loop_00 = (uv_udp_t *)puVar2;
    if (iVar1 != 0) goto LAB_0016977d;
    unaff_RBX = &tcp;
    puStack_20 = (uv_loop_t *)0x1696b9;
    check_buffer_size((uv_handle_t *)&tcp);
    puStack_20 = (uv_loop_t *)0x1696c8;
    uv_close((uv_handle_t *)&tcp,close_cb);
    puStack_20 = (uv_loop_t *)0x1696cd;
    loop_00 = (uv_udp_t *)uv_default_loop();
    puStack_20 = (uv_loop_t *)0x1696dc;
    iVar1 = uv_udp_init((uv_loop_t *)loop_00,&udp);
    if (iVar1 != 0) goto LAB_00169782;
    loop_00 = &udp;
    puStack_20 = (uv_loop_t *)0x1696f5;
    iVar1 = uv_udp_bind(&udp,(sockaddr *)&sStack_18,0);
    loop = (uv_udp_t *)unaff_RBX;
    if (iVar1 != 0) goto LAB_00169787;
    loop = &udp;
    puStack_20 = (uv_loop_t *)0x16970c;
    check_buffer_size((uv_handle_t *)&udp);
    puStack_20 = (uv_loop_t *)0x16971b;
    uv_close((uv_handle_t *)&udp,close_cb);
    puStack_20 = (uv_loop_t *)0x169720;
    loop_00 = (uv_udp_t *)uv_default_loop();
    puStack_20 = (uv_loop_t *)0x16972a;
    iVar1 = uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016978c;
    if (close_cb_called != 2) goto LAB_00169791;
    puStack_20 = (uv_loop_t *)0x16973c;
    loop = (uv_udp_t *)uv_default_loop();
    puStack_20 = (uv_loop_t *)0x169750;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    puStack_20 = (uv_loop_t *)0x16975a;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puStack_20 = (uv_loop_t *)0x16975f;
    loop_00 = (uv_udp_t *)uv_default_loop();
    puStack_20 = (uv_loop_t *)0x169767;
    iVar1 = uv_loop_close((uv_loop_t *)loop_00);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_20 = (uv_loop_t *)0x169778;
    run_test_socket_buffer_size_cold_1();
LAB_00169778:
    puStack_20 = (uv_loop_t *)0x16977d;
    run_test_socket_buffer_size_cold_2();
LAB_0016977d:
    puStack_20 = (uv_loop_t *)0x169782;
    run_test_socket_buffer_size_cold_3();
LAB_00169782:
    puStack_20 = (uv_loop_t *)0x169787;
    run_test_socket_buffer_size_cold_4();
    loop = (uv_udp_t *)unaff_RBX;
LAB_00169787:
    puStack_20 = (uv_loop_t *)0x16978c;
    run_test_socket_buffer_size_cold_5();
LAB_0016978c:
    puStack_20 = (uv_loop_t *)0x169791;
    run_test_socket_buffer_size_cold_6();
LAB_00169791:
    puStack_20 = (uv_loop_t *)0x169796;
    run_test_socket_buffer_size_cold_7();
  }
  puStack_20 = (uv_loop_t *)check_buffer_size;
  run_test_socket_buffer_size_cold_8();
  iStack_24 = 0;
  puStack_20 = (uv_loop_t *)loop;
  iVar1 = uv_recv_buffer_size((uv_handle_t *)loop_00,&iStack_24);
  if (iVar1 == 0) {
    if (iStack_24 < 1) goto LAB_00169809;
    iStack_24 = 10000;
    iVar1 = uv_recv_buffer_size((uv_handle_t *)loop_00,&iStack_24);
    if (iVar1 != 0) goto LAB_0016980e;
    iStack_24 = 0;
    iVar1 = uv_recv_buffer_size((uv_handle_t *)loop_00,&iStack_24);
    if (iVar1 == 0) {
      if ((iStack_24 == 10000) || (iStack_24 == 20000)) {
        return iStack_24;
      }
      goto LAB_00169818;
    }
  }
  else {
    check_buffer_size_cold_1();
LAB_00169809:
    check_buffer_size_cold_2();
LAB_0016980e:
    check_buffer_size_cold_3();
  }
  check_buffer_size_cold_4();
LAB_00169818:
  check_buffer_size_cold_5();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(socket_buffer_size) {
  struct sockaddr_in addr;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT(0 == uv_tcp_init(uv_default_loop(), &tcp));
  ASSERT(0 == uv_tcp_bind(&tcp, (struct sockaddr*) &addr, 0));
  check_buffer_size((uv_handle_t*) &tcp);
  uv_close((uv_handle_t*) &tcp, close_cb);

  ASSERT(0 == uv_udp_init(uv_default_loop(), &udp));
  ASSERT(0 == uv_udp_bind(&udp, (struct sockaddr*) &addr, 0));
  check_buffer_size((uv_handle_t*) &udp);
  uv_close((uv_handle_t*) &udp, close_cb);

  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}